

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O0

bool __thiscall rw::Atomic::streamWriteClump(Atomic *this,Stream *stream,FrameList_ *frmlst)

{
  Clump *pCVar1;
  LLLink *pLVar2;
  uint32 size;
  Frame *p;
  LLLink *pLVar3;
  Atomic *pAVar4;
  int32 size_00;
  LLLink *local_50;
  LLLink *lnk;
  LLLink *_next;
  Clump *c;
  int32 buf [4];
  FrameList_ *frmlst_local;
  Stream *stream_local;
  Atomic *this_local;
  
  buf._8_8_ = frmlst;
  memset(&c,0,0x10);
  pCVar1 = this->clump;
  if (pCVar1 == (Clump *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    size = streamGetSize(this);
    writeChunkHeader(stream,0x14,size);
    size_00 = 0x10;
    if (version < 0x30400) {
      size_00 = 0xc;
    }
    writeChunkHeader(stream,1,size_00);
    p = getFrame(this);
    c._0_4_ = findPointer(p,*(void ***)(buf._8_8_ + 8),*(int32 *)buf._8_8_);
    if (version < 0x30400) {
      c._4_4_ = (uint)(this->object).object.flags;
      Stream::write32(stream,&c,0xc);
      Geometry::streamWrite(this->geometry,stream);
LAB_0014ab6d:
      PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
      this_local._7_1_ = true;
    }
    else {
      c._4_4_ = 0;
      local_50 = (pCVar1->atomics).link.next;
      while( true ) {
        pLVar2 = local_50->next;
        pLVar3 = LinkList::end(&pCVar1->atomics);
        if (local_50 == pLVar3) break;
        pAVar4 = fromClump(local_50);
        if (pAVar4->geometry == this->geometry) {
          buf[0] = (int32)(this->object).object.flags;
          Stream::write32(stream,&c,0x10);
          goto LAB_0014ab6d;
        }
        c._4_4_ = c._4_4_ + 1;
        local_50 = pLVar2;
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
Atomic::streamWriteClump(Stream *stream, FrameList_ *frmlst)
{
	int32 buf[4] = { 0, 0, 0, 0 };
	Clump *c = this->clump;
	if(c == nil)
		return false;
	writeChunkHeader(stream, ID_ATOMIC, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, rw::version < 0x30400 ? 12 : 16);
	buf[0] = findPointer(this->getFrame(), (void**)frmlst->frames, frmlst->numFrames);

	if(version < 0x30400){
		buf[1] = this->object.object.flags;
		stream->write32(buf, sizeof(int32[3]));
		this->geometry->streamWrite(stream);
	}else{
		buf[1] = 0;
		FORLIST(lnk, c->atomics){
			if(Atomic::fromClump(lnk)->geometry == this->geometry)
				goto foundgeo;
			buf[1]++;
		}
		return false;
	foundgeo:
		buf[2] = this->object.object.flags;
		stream->write32(buf, sizeof(buf));
	}

	s_plglist.streamWrite(stream, this);
	return true;
}